

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O0

float __thiscall TransferFunctionSRGB::decode(TransferFunctionSRGB *this,float brightness)

{
  float in_XMM0_Da;
  float intensity;
  undefined4 local_10;
  
  if (0.04045 <= in_XMM0_Da) {
    powf((in_XMM0_Da + 0.055) * 0.94786733,2.4);
    local_10 = saturate<float>(0.0);
  }
  else {
    local_10 = saturate<float>(0.0);
  }
  return local_10;
}

Assistant:

float decode(const float brightness) const override {
        float intensity;

        if (brightness < .04045f)
            intensity = saturate(brightness * (1.0f/12.92f));
        else
            intensity = saturate(powf((brightness + .055f) * (1.0f/1.055f), 2.4f));

        return intensity;
    }